

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O2

void __thiscall
anurbs::BrepFaceField<4L>::BrepFaceField(BrepFaceField<4L> *this,Ref<anurbs::BrepFace> *face)

{
  allocator_type local_49;
  Ref<anurbs::BrepFace> local_48;
  __shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
  local_38;
  __shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2> *)face);
  Ref<anurbs::BrepFace>::data(&local_48);
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&(local_48.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_data);
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &((local_38._M_ptr)->m_data).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>);
  std::
  vector<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_std::allocator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  ::vector(&this->m_values,
           ((local_28._M_ptr)->m_poles).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.m_storage.m_rows,&local_49
          );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

BrepFaceField(Ref<BrepFace> face) : m_face(face),
        m_values(face->surface_geometry()->nb_poles())
    { }